

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

float nk_do_scrollbarv(nk_flags *state,nk_command_buffer *out,nk_rect scroll,int has_scrolling,
                      float offset,float target,float step,float button_pixel_inc,
                      nk_style_scrollbar *style,nk_input *in,nk_user_font *font)

{
  undefined8 uVar1;
  int iVar2;
  float fVar3;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  nk_rect bounds;
  nk_rect bounds_00;
  float local_e0;
  nk_rect local_c8;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  nk_rect cursor;
  nk_rect empty_north;
  nk_rect empty_south;
  
  fStack_a4 = scroll.y;
  uVar1 = scroll._0_8_;
  local_c8.x = scroll.x;
  local_c8.y = fStack_a4;
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5331,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (style == (nk_style_scrollbar *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5332,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5333,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  auVar7._0_12_ = ZEXT812(0x3f800000);
  auVar7._12_4_ = 0;
  auVar8._8_4_ = in_XMM1_Dc;
  auVar8._0_8_ = scroll._8_8_;
  auVar8._12_4_ = in_XMM1_Dd;
  auVar8 = maxps(auVar7,auVar8);
  local_c8.w = auVar8._0_4_;
  local_c8.h = auVar8._4_4_;
  fVar3 = 0.0;
  if (local_c8.h < target) {
    local_e0 = offset;
    fStack_a0 = fStack_a4;
    fStack_9c = fStack_a4;
    if (style->show_buttons != 0) {
      local_98._8_4_ = local_c8.w;
      local_98._0_8_ = uVar1;
      local_98._12_4_ = local_c8.h;
      fVar5 = local_c8.h - (local_c8.w + local_c8.w);
      fVar3 = step;
      if (button_pixel_inc <= step) {
        fVar3 = button_pixel_inc;
      }
      bounds.h = local_c8.w;
      bounds.w = local_c8.w;
      bounds.x = (float)(int)uVar1;
      bounds.y = (float)(int)((ulong)uVar1 >> 0x20);
      local_b8 = auVar8;
      local_a8 = fStack_a4;
      local_88 = local_c8.w;
      fStack_84 = local_c8.w;
      fStack_80 = local_c8.w;
      fStack_7c = local_c8.w;
      local_78 = local_c8.h;
      fStack_74 = local_c8.h;
      fStack_70 = local_c8.h;
      fStack_6c = local_c8.h;
      iVar2 = nk_do_button_symbol((nk_flags *)&empty_north,out,bounds,style->dec_symbol,
                                  NK_BUTTON_REPEATER,&style->dec_button,in,font);
      if (iVar2 != 0) {
        local_e0 = offset - fVar3;
      }
      fVar4 = 0.0;
      if (0.0 <= fVar5) {
        fVar4 = fVar5;
      }
      bounds_00.h = fStack_84;
      bounds_00.w = local_88;
      bounds_00.y = (local_78 + local_a8) - (float)local_b8._0_4_;
      bounds_00.x = (float)local_98._0_4_;
      iVar2 = nk_do_button_symbol((nk_flags *)&empty_north,out,bounds_00,style->inc_symbol,
                                  NK_BUTTON_REPEATER,&style->inc_button,in,font);
      if (iVar2 != 0) {
        local_e0 = local_e0 + fVar3;
      }
      local_c8.y = local_a8 + local_b8._0_4_;
      auVar8 = local_b8;
      local_c8.h = fVar4;
    }
    fVar3 = local_c8.h;
    if (local_c8.h <= step) {
      step = local_c8.h;
    }
    if (target - local_c8.h <= local_e0) {
      local_e0 = target - local_c8.h;
    }
    fVar5 = 0.0;
    if (0.0 <= local_e0) {
      fVar5 = local_e0;
    }
    fVar4 = style->border;
    fVar6 = (style->padding).y;
    cursor.y = (fVar5 / target) * local_c8.h + local_c8.y + fVar4 + fVar6;
    fVar6 = (local_c8.h / target) * local_c8.h - (fVar6 + fVar6 + fVar4 + fVar4);
    cursor.h = 0.0;
    if (0.0 <= fVar6) {
      cursor.h = fVar6;
    }
    fVar6 = (style->padding).x;
    cursor.x = fVar4 + local_c8.x + fVar6;
    empty_north.w = auVar8._0_4_;
    cursor.w = empty_north.w - (fVar6 + fVar6 + fVar4 + fVar4);
    empty_north.x = local_c8.x;
    empty_south.y = cursor.h + cursor.y;
    empty_north.h = 0.0;
    if (0.0 <= cursor.y - local_c8.y) {
      empty_north.h = cursor.y - local_c8.y;
    }
    empty_south.x = local_c8.x;
    fVar4 = (local_c8.h + local_c8.y) - empty_south.y;
    empty_south.h = 0.0;
    if (0.0 <= fVar4) {
      empty_south.h = fVar4;
    }
    local_a8 = local_c8.y;
    empty_north.y = local_c8.y;
    empty_south.w = empty_north.w;
    fVar5 = nk_scrollbar_behavior
                      (state,in,has_scrolling,&local_c8,&cursor,&empty_north,&empty_south,fVar5,
                       target,step,NK_VERTICAL);
    local_b8._0_4_ = fVar5;
    cursor.y = (fVar5 / target) * fVar3 + local_a8 + style->border_cursor + (style->padding).y;
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    }
    nk_draw_scrollbar(out,*state,style,&local_c8,&cursor);
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
    fVar3 = (float)local_b8._0_4_;
  }
  return fVar3;
}

Assistant:

NK_LIB float
nk_do_scrollbarv(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect scroll, int has_scrolling,
    float offset, float target, float step, float button_pixel_inc,
    const struct nk_style_scrollbar *style, struct nk_input *in,
    const struct nk_user_font *font)
{
    struct nk_rect empty_north;
    struct nk_rect empty_south;
    struct nk_rect cursor;

    float scroll_step;
    float scroll_offset;
    float scroll_off;
    float scroll_ratio;

    NK_ASSERT(out);
    NK_ASSERT(style);
    NK_ASSERT(state);
    if (!out || !style) return 0;

    scroll.w = NK_MAX(scroll.w, 1);
    scroll.h = NK_MAX(scroll.h, 0);
    if (target <= scroll.h) return 0;

    /* optional scrollbar buttons */
    if (style->show_buttons) {
        nk_flags ws;
        float scroll_h;
        struct nk_rect button;

        button.x = scroll.x;
        button.w = scroll.w;
        button.h = scroll.w;

        scroll_h = NK_MAX(scroll.h - 2 * button.h,0);
        scroll_step = NK_MIN(step, button_pixel_inc);

        /* decrement button */
        button.y = scroll.y;
        if (nk_do_button_symbol(&ws, out, button, style->dec_symbol,
            NK_BUTTON_REPEATER, &style->dec_button, in, font))
            offset = offset - scroll_step;

        /* increment button */
        button.y = scroll.y + scroll.h - button.h;
        if (nk_do_button_symbol(&ws, out, button, style->inc_symbol,
            NK_BUTTON_REPEATER, &style->inc_button, in, font))
            offset = offset + scroll_step;

        scroll.y = scroll.y + button.h;
        scroll.h = scroll_h;
    }

    /* calculate scrollbar constants */
    scroll_step = NK_MIN(step, scroll.h);
    scroll_offset = NK_CLAMP(0, offset, target - scroll.h);
    scroll_ratio = scroll.h / target;
    scroll_off = scroll_offset / target;

    /* calculate scrollbar cursor bounds */
    cursor.h = NK_MAX((scroll_ratio * scroll.h) - (2*style->border + 2*style->padding.y), 0);
    cursor.y = scroll.y + (scroll_off * scroll.h) + style->border + style->padding.y;
    cursor.w = scroll.w - (2 * style->border + 2 * style->padding.x);
    cursor.x = scroll.x + style->border + style->padding.x;

    /* calculate empty space around cursor */
    empty_north.x = scroll.x;
    empty_north.y = scroll.y;
    empty_north.w = scroll.w;
    empty_north.h = NK_MAX(cursor.y - scroll.y, 0);

    empty_south.x = scroll.x;
    empty_south.y = cursor.y + cursor.h;
    empty_south.w = scroll.w;
    empty_south.h = NK_MAX((scroll.y + scroll.h) - (cursor.y + cursor.h), 0);

    /* update scrollbar */
    scroll_offset = nk_scrollbar_behavior(state, in, has_scrolling, &scroll, &cursor,
        &empty_north, &empty_south, scroll_offset, target, scroll_step, NK_VERTICAL);
    scroll_off = scroll_offset / target;
    cursor.y = scroll.y + (scroll_off * scroll.h) + style->border_cursor + style->padding.y;

    /* draw scrollbar */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_scrollbar(out, *state, style, &scroll, &cursor);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return scroll_offset;
}